

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_rotate_transform_3d(ALLEGRO_TRANSFORM *trans,float x,float y,float z,float angle)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  ALLEGRO_TRANSFORM *trans_00;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ALLEGRO_TRANSFORM tmp;
  double cc;
  double c;
  double s;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  dVar1 = sin((double)in_XMM3_Da);
  dVar2 = cos((double)in_XMM3_Da);
  trans_00 = (ALLEGRO_TRANSFORM *)(1.0 - dVar2);
  al_identity_transform((ALLEGRO_TRANSFORM *)&local_70);
  local_70 = (float)((double)trans_00 * (double)in_XMM0_Da * (double)in_XMM0_Da + dVar2);
  local_6c = (float)((double)trans_00 * (double)in_XMM0_Da * (double)in_XMM1_Da +
                    (double)in_XMM2_Da * dVar1);
  local_68 = (float)((double)trans_00 * (double)in_XMM0_Da * (double)in_XMM2_Da +
                    -((double)in_XMM1_Da * dVar1));
  local_64 = 0.0;
  local_60 = (float)((double)trans_00 * (double)in_XMM0_Da * (double)in_XMM1_Da +
                    -((double)in_XMM2_Da * dVar1));
  local_5c = (float)((double)trans_00 * (double)in_XMM1_Da * (double)in_XMM1_Da + dVar2);
  local_58 = (float)((double)trans_00 * (double)in_XMM2_Da * (double)in_XMM1_Da +
                    (double)in_XMM0_Da * dVar1);
  local_54 = 0.0;
  local_50 = (float)((double)trans_00 * (double)in_XMM0_Da * (double)in_XMM2_Da +
                    (double)in_XMM1_Da * dVar1);
  local_4c = (float)((double)trans_00 * (double)in_XMM1_Da * (double)in_XMM2_Da +
                    -((double)in_XMM0_Da * dVar1));
  local_48 = (float)((double)trans_00 * (double)in_XMM2_Da * (double)in_XMM2_Da + dVar2);
  local_44 = 0.0;
  local_40 = 0.0;
  local_3c = 0.0;
  al_compose_transform(trans_00,(ALLEGRO_TRANSFORM *)0x3f80000000000000);
  return;
}

Assistant:

void al_rotate_transform_3d(ALLEGRO_TRANSFORM *trans,
   float x, float y, float z, float angle)
{
   double s = sin(angle);
   double c = cos(angle);
   double cc = 1 - c;
   ALLEGRO_TRANSFORM tmp;

   al_identity_transform(&tmp);

   tmp.m[0][0] = (cc * x * x) + c;
   tmp.m[0][1] = (cc * x * y) + (z * s);
   tmp.m[0][2] = (cc * x * z) - (y * s);
   tmp.m[0][3] = 0;

   tmp.m[1][0] = (cc * x * y) - (z * s);
   tmp.m[1][1] = (cc * y * y) + c;
   tmp.m[1][2] = (cc * z * y) + (x * s);
   tmp.m[1][3] = 0;

   tmp.m[2][0] = (cc * x * z) + (y * s);
   tmp.m[2][1] = (cc * y * z) - (x * s);
   tmp.m[2][2] = (cc * z * z) + c;
   tmp.m[2][3] = 0;

   tmp.m[3][0] = 0;
   tmp.m[3][1] = 0;
   tmp.m[3][2] = 0;
   tmp.m[3][3] = 1;

   al_compose_transform(trans, &tmp);
}